

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_ecdsa_adaptor.cpp
# Opt level: O2

AdaptorPair *
cfd::core::AdaptorUtil::Sign
          (AdaptorPair *__return_storage_ptr__,ByteData256 *msg,Privkey *sk,Pubkey *adaptor)

{
  int iVar1;
  secp256k1_context_struct *ctx;
  CfdException *this;
  AdaptorProof adaptor_proof;
  AdaptorSignature adaptor_sig;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_d0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> adaptor_proof_raw;
  vector<unsigned_char,_std::allocator<unsigned_char>_> adaptor_sig_raw;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  secp256k1_pubkey adaptor_key;
  
  ctx = wally_get_secp_context();
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&adaptor_sig_raw,0x41,(allocator_type *)&adaptor_key);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&adaptor_proof_raw,0x61,(allocator_type *)&adaptor_key);
  ParsePubkey(&adaptor_key,adaptor);
  Privkey::GetData(&adaptor_proof.data_,sk);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&adaptor_sig,
                     &adaptor_proof.data_);
  ByteData256::GetData((ByteData *)&local_88,msg);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_d0,
                     (ByteData *)&local_88);
  iVar1 = secp256k1_ecdsa_adaptor_sign
                    (ctx,adaptor_sig_raw.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start,
                     adaptor_proof_raw.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     adaptor_sig.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,&adaptor_key,
                     local_d0._M_impl.super__Vector_impl_data._M_start);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_d0);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_88);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&adaptor_sig);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&adaptor_proof);
  if (iVar1 == 1) {
    ByteData::ByteData(&adaptor_proof.data_,&adaptor_sig_raw);
    AdaptorSignature::AdaptorSignature(&adaptor_sig,&adaptor_proof.data_);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&adaptor_proof);
    ByteData::ByteData((ByteData *)&local_d0,&adaptor_proof_raw);
    AdaptorProof::AdaptorProof(&adaptor_proof,(ByteData *)&local_d0);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_d0);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__return_storage_ptr__,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&adaptor_sig);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &__return_storage_ptr__->proof,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&adaptor_proof);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&adaptor_proof);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&adaptor_sig);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&adaptor_proof_raw.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
    ;
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&adaptor_sig_raw.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    return __return_storage_ptr__;
  }
  this = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string
            ((string *)&adaptor_sig,"Could not create adaptor signature.",
             (allocator *)&adaptor_proof);
  CfdException::CfdException(this,kCfdInternalError,(string *)&adaptor_sig);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

AdaptorPair AdaptorUtil::Sign(
    const ByteData256 &msg, const Privkey &sk, const Pubkey &adaptor) {
  auto ctx = wally_get_secp_context();
  std::vector<uint8_t> adaptor_sig_raw(
      AdaptorSignature::kAdaptorSignatureSize);
  std::vector<uint8_t> adaptor_proof_raw(AdaptorProof::kAdaptorProofSize);
  auto adaptor_key = ParsePubkey(adaptor);
  auto ret = secp256k1_ecdsa_adaptor_sign(
      ctx, adaptor_sig_raw.data(), adaptor_proof_raw.data(),
      sk.GetData().GetBytes().data(), &adaptor_key,
      msg.GetData().GetBytes().data());
  if (ret != 1) {
    throw CfdException(
        CfdError::kCfdInternalError, "Could not create adaptor signature.");
  }
  AdaptorSignature adaptor_sig(adaptor_sig_raw);
  AdaptorProof adaptor_proof(adaptor_proof_raw);

  return AdaptorPair{adaptor_sig, adaptor_proof};
}